

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::QDateTimeEdit(QDateTimeEdit *this,QDate date,QWidget *parent)

{
  QDate QVar1;
  QDateTimeEditPrivate *pQVar2;
  long in_FS_OFFSET;
  QDate local_58;
  Data local_50 [4];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QDateTimeEditPrivate *)operator_new(0x510);
  local_50[0] = (Data)0x1;
  QDateTimeEditPrivate::QDateTimeEditPrivate(pQVar2,(QTimeZone *)&local_50[0].s);
  QAbstractSpinBox::QAbstractSpinBox
            ((QAbstractSpinBox *)this,(QAbstractSpinBoxPrivate *)pQVar2,parent);
  QTimeZone::~QTimeZone((QTimeZone *)&local_50[0].s);
  *(undefined ***)&(this->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_007cae28;
  *(undefined ***)&(this->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QDateTimeEdit_007cb018;
  pQVar2 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  QVar1.jd = date.jd;
  if (0x16d3e147973 < date.jd + 0xb69eeff91fU) {
    QDate::QDate(&local_58,2000,1,1);
    QVar1.jd = local_58.jd;
  }
  local_58.jd = QVar1.jd;
  ::QVariant::QVariant((QVariant *)&local_50[0].s,local_58);
  QDateTimeEditPrivate::init(pQVar2,(EVP_PKEY_CTX *)&local_50[0].s);
  ::QVariant::~QVariant((QVariant *)&local_50[0].s);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDateTimeEdit::QDateTimeEdit(QDate date, QWidget *parent)
    : QAbstractSpinBox(*new QDateTimeEditPrivate, parent)
{
    Q_D(QDateTimeEdit);
    d->init(date.isValid() ? date : QDATETIMEEDIT_DATE_INITIAL);
}